

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O2

REF_STATUS ref_agents_migrate(REF_AGENTS ref_agents)

{
  REF_AGENT_STRUCT *pRVar1;
  REF_AGENT_STRUCT *pRVar2;
  REF_MPI ref_mpi;
  REF_STATUS RVar3;
  REF_INT *proc;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  int nsend;
  long lVar9;
  char *pcVar10;
  REF_INT id;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  REF_INT dest;
  REF_INT local_7c;
  void *local_78;
  void *local_70;
  long local_68;
  long local_60;
  REF_MPI local_58;
  REF_INT nrecv;
  REF_DBL *recv_dbl;
  REF_GLOB *recv_glob;
  REF_INT *recv_int;
  
  local_58 = ref_agents->ref_mpi;
  lVar14 = 0;
  uVar8 = 0;
  for (lVar11 = 0; uVar13 = (ulong)ref_agents->max, lVar11 < (long)uVar13; lVar11 = lVar11 + 1) {
    if (*(int *)((long)ref_agents->agent->xyz + lVar14 + -0x30) != 0) {
      RVar3 = ref_agents_dest(ref_agents,(REF_INT)lVar11,&dest);
      if (RVar3 != 0) {
        pcVar10 = "dest";
        uVar13 = 1;
        uVar7 = 0x115;
        goto LAB_0018f8c3;
      }
      uVar8 = uVar8 + (local_58->id != dest);
    }
    lVar14 = lVar14 + 0x68;
  }
  if ((int)uVar8 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x11d,
           "ref_agents_migrate","malloc destination of REF_INT negative");
LAB_0018f924:
    RVar3 = 1;
  }
  else {
    uVar6 = (ulong)uVar8;
    proc = (REF_INT *)malloc(uVar6 * 4);
    if (proc == (REF_INT *)0x0) {
      pcVar10 = "malloc destination of REF_INT NULL";
      uVar7 = 0x11d;
    }
    else {
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        proc[uVar4] = -1;
      }
      pvVar5 = malloc((ulong)(uVar8 * 6) * 4);
      if (pvVar5 == (void *)0x0) {
        pcVar10 = "malloc send_int of REF_INT NULL";
        uVar7 = 0x11e;
      }
      else {
        for (uVar4 = 0; uVar8 * 6 != uVar4; uVar4 = uVar4 + 1) {
          *(undefined4 *)((long)pvVar5 + uVar4 * 4) = 0xffffffff;
        }
        local_70 = pvVar5;
        pvVar5 = malloc(uVar6 * 8);
        if (pvVar5 == (void *)0x0) {
          pcVar10 = "malloc send_glob of REF_GLOB NULL";
          uVar7 = 0x11f;
        }
        else {
          for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
            *(undefined8 *)((long)pvVar5 + uVar4 * 8) = 0xffffffffffffffff;
          }
          local_78 = pvVar5;
          pvVar5 = malloc((ulong)(uVar8 * 7) * 8);
          if (pvVar5 != (void *)0x0) {
            for (uVar6 = 0; uVar8 * 7 != uVar6; uVar6 = uVar6 + 1) {
              *(undefined8 *)((long)pvVar5 + uVar6 * 8) = 0;
            }
            lVar12 = 0;
            lVar11 = 0x30;
            lVar14 = 0x48;
            nsend = 0;
            do {
              ref_mpi = local_58;
              id = (REF_INT)lVar12;
              if ((int)uVar13 <= lVar12) {
                local_7c = id;
                uVar8 = ref_mpi_blindsend(local_58,proc,local_70,6,nsend,&recv_int,&nrecv,1);
                if (uVar8 == 0) {
                  uVar8 = ref_mpi_blindsend(ref_mpi,proc,local_78,1,nsend,&recv_glob,&nrecv,2);
                  if (uVar8 == 0) {
                    uVar8 = ref_mpi_blindsend(ref_mpi,proc,pvVar5,7,nsend,&recv_dbl,&nrecv,3);
                    if (uVar8 == 0) {
                      free(pvVar5);
                      free(local_78);
                      free(local_70);
                      free(proc);
                      lVar11 = 0x18;
                      lVar14 = 0;
                      lVar12 = 0;
                      while( true ) {
                        if (nrecv <= lVar12) {
                          free(recv_dbl);
                          free(recv_glob);
                          free(recv_int);
                          return 0;
                        }
                        uVar8 = ref_agents_new(ref_agents,&local_7c);
                        if (uVar8 != 0) break;
                        pRVar2 = ref_agents->agent;
                        pRVar1 = pRVar2 + local_7c;
                        pRVar1->mode = recv_int[lVar12 * 6];
                        pRVar1->home = recv_int[lVar12 * 6 + 1];
                        pRVar1->node = recv_int[lVar12 * 6 + 2];
                        pRVar1->part = recv_int[lVar12 * 6 + 3];
                        pRVar1->seed = recv_int[lVar12 * 6 + 4];
                        pRVar1->step = recv_int[lVar12 * 6 + 5];
                        pRVar1->global = recv_glob[lVar12];
                        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                          pRVar1->xyz[lVar9] = *(REF_DBL *)((long)recv_dbl + lVar9 * 8 + lVar14);
                        }
                        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
                          pRVar2[local_7c].bary[lVar9] =
                               *(REF_DBL *)((long)recv_dbl + lVar9 * 8 + lVar11);
                        }
                        lVar12 = lVar12 + 1;
                        lVar14 = lVar14 + 0x38;
                        lVar11 = lVar11 + 0x38;
                      }
                      uVar13 = (ulong)uVar8;
                      pcVar10 = "new";
                      uVar7 = 0x149;
                    }
                    else {
                      uVar13 = (ulong)uVar8;
                      pcVar10 = "ds";
                      uVar7 = 0x142;
                    }
                  }
                  else {
                    uVar13 = (ulong)uVar8;
                    pcVar10 = "is";
                    uVar7 = 0x13f;
                  }
                }
                else {
                  uVar13 = (ulong)uVar8;
                  pcVar10 = "is";
                  uVar7 = 0x13c;
                }
LAB_0018f8c3:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                       ,uVar7,"ref_agents_migrate",uVar13,pcVar10);
                return (REF_STATUS)uVar13;
              }
              if (ref_agents->agent[lVar12].mode != REF_AGENT_UNUSED) {
                local_68 = lVar14;
                local_60 = lVar11;
                uVar8 = ref_agents_dest(ref_agents,id,&dest);
                if (uVar8 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                         ,0x123,"ref_agents_migrate",(ulong)uVar8,"dest");
                  goto LAB_0018f924;
                }
                lVar11 = local_60;
                lVar14 = local_68;
                if (local_58->id != dest) {
                  proc[nsend] = dest;
                  pRVar1 = ref_agents->agent;
                  lVar11 = (long)(nsend * 6);
                  *(REF_AGENT_MODE *)((long)local_70 + lVar11 * 4) = pRVar1[lVar12].mode;
                  *(REF_INT *)((long)local_70 + (long)(nsend * 6 + 1) * 4) = pRVar1[lVar12].home;
                  *(REF_INT *)((long)local_70 + lVar11 * 4 + 8) = pRVar1[lVar12].node;
                  *(REF_INT *)((long)local_70 + lVar11 * 4 + 0xc) = pRVar1[lVar12].part;
                  *(REF_INT *)((long)local_70 + lVar11 * 4 + 0x10) = pRVar1[lVar12].seed;
                  *(REF_INT *)((long)local_70 + lVar11 * 4 + 0x14) = pRVar1[lVar12].step;
                  *(REF_GLOB *)((long)local_78 + (long)nsend * 8) = pRVar1[lVar12].global;
                  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
                    *(undefined8 *)((long)pvVar5 + lVar11 * 8 + (long)(nsend * 7) * 8) =
                         *(undefined8 *)((long)pRVar1->xyz + lVar11 * 8 + local_60 + -0x30);
                  }
                  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
                    *(undefined8 *)((long)pvVar5 + (long)(nsend * 7 + 3 + (int)lVar11) * 8) =
                         *(undefined8 *)((long)pRVar1->xyz + lVar11 * 8 + local_68 + -0x30);
                  }
                  uVar8 = ref_agents_remove(ref_agents,id);
                  if (uVar8 != 0) {
                    uVar13 = (ulong)uVar8;
                    pcVar10 = "poof";
                    uVar7 = 0x134;
                    goto LAB_0018f8c3;
                  }
                  nsend = nsend + 1;
                  lVar11 = local_60;
                  lVar14 = local_68;
                }
              }
              lVar12 = lVar12 + 1;
              uVar13 = (ulong)(uint)ref_agents->max;
              lVar11 = lVar11 + 0x68;
              lVar14 = lVar14 + 0x68;
            } while( true );
          }
          pcVar10 = "malloc send_dbl of REF_DBL NULL";
          uVar7 = 0x120;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",uVar7,
           "ref_agents_migrate",pcVar10);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_agents_migrate(REF_AGENTS ref_agents) {
  REF_MPI ref_mpi = ref_agents->ref_mpi;
  REF_INT i, id, nsend, nrecv, dest, rec;
  REF_INT n_ints, n_globs, n_dbls;
  REF_INT *destination, *send_int, *recv_int;
  REF_GLOB *send_glob, *recv_glob;
  REF_DBL *send_dbl, *recv_dbl;
  nsend = 0;
  each_active_ref_agent(ref_agents, id) {
    RSS(ref_agents_dest(ref_agents, id, &dest), "dest");
    if (ref_mpi_rank(ref_mpi) != dest) {
      nsend++;
    }
  }
  n_ints = 6;
  n_globs = 1;
  n_dbls = 7;
  ref_malloc_init(destination, nsend, REF_INT, REF_EMPTY);
  ref_malloc_init(send_int, nsend * n_ints, REF_INT, REF_EMPTY);
  ref_malloc_init(send_glob, nsend * n_globs, REF_GLOB, REF_EMPTY);
  ref_malloc_init(send_dbl, nsend * n_dbls, REF_DBL, 0.0);
  nsend = 0;
  each_active_ref_agent(ref_agents, id) {
    RSS(ref_agents_dest(ref_agents, id, &dest), "dest");
    if (ref_mpi_rank(ref_mpi) != dest) {
      destination[nsend] = dest;
      send_int[0 + nsend * n_ints] = (REF_INT)ref_agent_mode(ref_agents, id);
      send_int[1 + nsend * n_ints] = ref_agent_home(ref_agents, id);
      send_int[2 + nsend * n_ints] = ref_agent_node(ref_agents, id);
      send_int[3 + nsend * n_ints] = ref_agent_part(ref_agents, id);
      send_int[4 + nsend * n_ints] = ref_agent_seed(ref_agents, id);
      send_int[5 + nsend * n_ints] = ref_agent_step(ref_agents, id);

      send_glob[0 + nsend * n_globs] = ref_agent_global(ref_agents, id);

      for (i = 0; i < 3; i++)
        send_dbl[i + nsend * n_dbls] = ref_agent_xyz(ref_agents, i, id);
      for (i = 0; i < 4; i++)
        send_dbl[3 + i + nsend * n_dbls] = ref_agent_bary(ref_agents, i, id);

      RSS(ref_agents_remove(ref_agents, id), "poof");

      nsend++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_int, n_ints, nsend,
                        (void **)(&recv_int), &nrecv, REF_INT_TYPE),
      "is");
  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_glob, n_globs, nsend,
                        (void **)(&recv_glob), &nrecv, REF_GLOB_TYPE),
      "is");
  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_dbl, n_dbls, nsend,
                        (void **)(&recv_dbl), &nrecv, REF_DBL_TYPE),
      "ds");
  ref_free(send_dbl);
  ref_free(send_glob);
  ref_free(send_int);
  ref_free(destination);

  for (rec = 0; rec < nrecv; rec++) {
    RSS(ref_agents_new(ref_agents, &id), "new");
    ref_agent_mode(ref_agents, id) = (REF_AGENT_MODE)recv_int[0 + rec * n_ints];
    ref_agent_home(ref_agents, id) = recv_int[1 + rec * n_ints];
    ref_agent_node(ref_agents, id) = recv_int[2 + rec * n_ints];
    ref_agent_part(ref_agents, id) = recv_int[3 + rec * n_ints];
    ref_agent_seed(ref_agents, id) = recv_int[4 + rec * n_ints];
    ref_agent_step(ref_agents, id) = recv_int[5 + rec * n_ints];

    ref_agent_global(ref_agents, id) = recv_glob[0 + rec * n_globs];

    for (i = 0; i < 3; i++)
      ref_agent_xyz(ref_agents, i, id) = recv_dbl[i + rec * n_dbls];
    for (i = 0; i < 4; i++)
      ref_agent_bary(ref_agents, i, id) = recv_dbl[3 + i + rec * n_dbls];
  }

  ref_free(recv_dbl);
  ref_free(recv_glob);
  ref_free(recv_int);

  return REF_SUCCESS;
}